

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer.cc
# Opt level: O0

void prometheus::anon_unknown_5::SerializeHistogram
               (ostream *out,MetricFamily *family,ClientMetric *metric)

{
  Histogram *pHVar1;
  ClientMetric *pCVar2;
  MetricFamily *pMVar3;
  bool bVar4;
  vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_> *this;
  double dVar5;
  allocator local_1d9;
  string local_1d8;
  allocator local_1b1;
  string local_1b0;
  allocator local_189;
  string local_188;
  allocator local_161;
  string local_160;
  reference local_140;
  Bucket *b;
  const_iterator __end2;
  const_iterator __begin2;
  vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  *__range2;
  double last;
  allocator local_f1;
  string local_f0;
  allocator local_c9;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  Histogram *local_28;
  Histogram *hist;
  ClientMetric *metric_local;
  MetricFamily *family_local;
  ostream *out_local;
  
  local_28 = &metric->histogram;
  hist = (Histogram *)metric;
  metric_local = (ClientMetric *)family;
  family_local = (MetricFamily *)out;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"_count",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"",&local_81);
  std::__cxx11::string::string((string *)&local_a8);
  (anonymous_namespace)::WriteHead<std::__cxx11::string>
            (out,family,metric,&local_48,&local_80,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::ostream::operator<<(family_local,local_28->sample_count);
  WriteTail((ostream *)family_local,(ClientMetric *)hist);
  pMVar3 = family_local;
  pCVar2 = metric_local;
  pHVar1 = hist;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"_sum",&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"",&local_f1);
  std::__cxx11::string::string((string *)&last);
  (anonymous_namespace)::WriteHead<std::__cxx11::string>
            ((ostream *)pMVar3,(MetricFamily *)pCVar2,(ClientMetric *)pHVar1,&local_c8,&local_f0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&last);
  std::__cxx11::string::~string((string *)&last);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  WriteValue((ostream *)family_local,local_28->sample_sum);
  WriteTail((ostream *)family_local,(ClientMetric *)hist);
  dVar5 = std::numeric_limits<double>::infinity();
  __range2 = (vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
              *)((ulong)dVar5 ^ 0x8000000000000000);
  this = &local_28->bucket;
  __end2 = std::
           vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
           ::begin(this);
  b = (Bucket *)
      std::
      vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>::
      end(this);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_prometheus::ClientMetric::Bucket_*,_std::vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>_>
                                     *)&b), bVar4) {
    local_140 = __gnu_cxx::
                __normal_iterator<const_prometheus::ClientMetric::Bucket_*,_std::vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>_>
                ::operator*(&__end2);
    pMVar3 = family_local;
    pCVar2 = metric_local;
    pHVar1 = hist;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_160,"_bucket",&local_161);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_188,"le",&local_189);
    WriteHead<double>((ostream *)pMVar3,(MetricFamily *)pCVar2,(ClientMetric *)pHVar1,&local_160,
                      &local_188,&local_140->upper_bound);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    __range2 = (vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
                *)local_140->upper_bound;
    std::ostream::operator<<(family_local,local_140->cumulative_count);
    WriteTail((ostream *)family_local,(ClientMetric *)hist);
    __gnu_cxx::
    __normal_iterator<const_prometheus::ClientMetric::Bucket_*,_std::vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>_>
    ::operator++(&__end2);
  }
  dVar5 = std::numeric_limits<double>::infinity();
  pMVar3 = family_local;
  pCVar2 = metric_local;
  pHVar1 = hist;
  if (((double)__range2 != dVar5) || (NAN((double)__range2) || NAN(dVar5))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1b0,"_bucket",&local_1b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1d8,"le",&local_1d9);
    WriteHead<char[5]>((ostream *)pMVar3,(MetricFamily *)pCVar2,(ClientMetric *)pHVar1,&local_1b0,
                       &local_1d8,(char (*) [5])"+Inf");
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    std::ostream::operator<<(family_local,local_28->sample_count);
    WriteTail((ostream *)family_local,(ClientMetric *)hist);
  }
  return;
}

Assistant:

void SerializeHistogram(std::ostream& out, const MetricFamily& family,
                        const ClientMetric& metric) {
  auto& hist = metric.histogram;
  WriteHead(out, family, metric, "_count");
  out << hist.sample_count;
  WriteTail(out, metric);

  WriteHead(out, family, metric, "_sum");
  WriteValue(out, hist.sample_sum);
  WriteTail(out, metric);

  double last = -std::numeric_limits<double>::infinity();
  for (auto& b : hist.bucket) {
    WriteHead(out, family, metric, "_bucket", "le", b.upper_bound);
    last = b.upper_bound;
    out << b.cumulative_count;
    WriteTail(out, metric);
  }

  if (last != std::numeric_limits<double>::infinity()) {
    WriteHead(out, family, metric, "_bucket", "le", "+Inf");
    out << hist.sample_count;
    WriteTail(out, metric);
  }
}